

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocketsphinx.c
# Opt level: O2

int ps_process_cep(ps_decoder_t *ps,float32 **data,int32 n_frames,int no_search,int full_utt)

{
  int iVar1;
  int iVar2;
  int32 n_frames_local;
  mfcc_t **ptr;
  
  n_frames_local = n_frames;
  ptr = data;
  if (no_search != 0) {
    acmod_set_grow(ps->acmod,1);
  }
  iVar2 = 0;
  while( true ) {
    while( true ) {
      if (n_frames == 0) {
        return iVar2;
      }
      iVar1 = acmod_process_cep(ps->acmod,&ptr,&n_frames_local,full_utt);
      if (-1 < iVar1 && no_search == 0) break;
      n_frames = n_frames_local;
      if (iVar1 < 0) {
        return iVar1;
      }
    }
    iVar1 = ps_search_forward(ps);
    if (iVar1 < 0) break;
    iVar2 = iVar2 + iVar1;
    n_frames = n_frames_local;
  }
  return iVar1;
}

Assistant:

int
ps_process_cep(ps_decoder_t *ps,
               float32 **data,
               int32 n_frames,
               int no_search,
               int full_utt)
{
    int n_searchfr = 0;

#ifdef FIXED_POINT
    mfcc_t **idata, **ptr;
    ptr = idata = ckd_calloc_2d(n_frames,
                                fe_get_output_size(ps->acmod->fe),
                                sizeof(**idata));
    fe_float_to_mfcc(ps->acmod->fe, data, idata, n_frames);
#else
    mfcc_t **ptr = data;
#endif

    if (no_search)
        acmod_set_grow(ps->acmod, TRUE);

    while (n_frames) {
        int nfr;

        /* Process some data into features. */
        if ((nfr = acmod_process_cep(ps->acmod, &ptr,
                                     &n_frames, full_utt)) < 0)
            return nfr;

        /* Score and search as much data as possible */
        if (no_search)
            continue;
        if ((nfr = ps_search_forward(ps)) < 0)
            return nfr;
        n_searchfr += nfr;
    }
#ifdef FIXED_POINT
    ckd_free_2d(idata);
#endif

    return n_searchfr;
}